

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Semaphore>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  RefData<vk::Handle<(vk::HandleType)4>_> data;
  bool bVar1;
  deUint32 queueFamilyIndex_;
  VkAllocationCallbacks *pVVar2;
  PlatformInterface *vkp_;
  DeviceInterface *vkd_;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries_;
  TestContext *pTVar3;
  TestLog *pTVar4;
  allocator<char> local_931;
  string local_930;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  uint local_8c0;
  allocator<char> local_8b9;
  string local_8b8;
  Move<vk::Handle<(vk::HandleType)4>_> local_898;
  RefData<vk::Handle<(vk::HandleType)4>_> local_878;
  undefined1 local_858 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> obj;
  Environment objEnv;
  AllocationCallbackRecorder objCallbacks;
  undefined8 uStack_798;
  Resources res;
  undefined1 local_790 [8];
  EnvClone resEnv;
  undefined1 local_c0 [8];
  Environment rootEnv;
  AllocationCallbackRecorder resCallbacks;
  deUint32 noCmdScope;
  Context *context_local;
  TestStatus *pTStack_10;
  Parameters params_local;
  
  context_local._4_4_ = params.flags;
  pTStack_10 = __return_storage_ptr__;
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,pVVar2,0x80);
  vkp_ = Context::getPlatformInterface(context);
  vkd_ = Context::getDeviceInterface(context);
  device_ = Context::getDevice(context);
  queueFamilyIndex_ = Context::getUniversalQueueFamilyIndex(context);
  programBinaries_ = Context::getBinaryCollection(context);
  pVVar2 = ::vk::AllocationCallbacks::getCallbacks
                     ((AllocationCallbacks *)&rootEnv.maxResourceConsumers);
  Environment::Environment
            ((Environment *)local_c0,vkp_,vkd_,device_,queueFamilyIndex_,programBinaries_,pVVar2,1);
  uStack_798 = getDefaulDeviceParameters(context);
  EnvClone::EnvClone((EnvClone *)local_790,(Environment *)local_c0,
                     (Parameters *)&stack0xfffffffffffff868,1);
  Semaphore::Resources::Resources
            ((Resources *)((long)&objCallbacks.m_records.m_last + 7),
             (Environment *)&resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE,
             (Parameters *)((long)&context_local + 4));
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,pVVar2,0x80);
  pVVar2 = ::vk::AllocationCallbacks::getCallbacks
                     ((AllocationCallbacks *)&objEnv.maxResourceConsumers);
  Environment::Environment
            ((Environment *)
             &obj.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator,
             (PlatformInterface *)resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE,
             (DeviceInterface *)resEnv.env.vkp,(VkDevice)resEnv.env.vkd,(deUint32)resEnv.env.device,
             (BinaryCollection *)resEnv.env._24_8_,pVVar2,(deUint32)resEnv.env.allocationCallbacks);
  Semaphore::create(&local_898,
                    (Environment *)
                    &obj.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator,
                    (Resources *)((long)&objCallbacks.m_records.m_last + 7),
                    (Parameters *)((long)&context_local + 4));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_878,(Move *)&local_898);
  data.deleter.m_deviceIface._0_4_ = (int)local_878.deleter.m_deviceIface;
  data.object.m_internal = local_878.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_878.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_878.deleter.m_device;
  data.deleter.m_allocator = local_878.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_858,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move(&local_898);
  pTVar3 = Context::getTestContext(context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  bVar1 = ::vk::validateAndLog
                    (pTVar4,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0x1e);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b8,"Invalid allocation callback",&local_8b9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_8b8);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::allocator<char>::~allocator(&local_8b9);
  }
  local_8c0 = (uint)!bVar1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_858);
  if (local_8c0 == 0) {
    pTVar3 = Context::getTestContext(context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    bVar1 = ::vk::validateAndLog
                      (pTVar4,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0);
    if (bVar1) {
      local_8c0 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8e0,"Invalid allocation callback",&local_8e1);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_8e0);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::allocator<char>::~allocator(&local_8e1);
      local_8c0 = 1;
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers);
  EnvClone::~EnvClone((EnvClone *)local_790);
  if (local_8c0 == 0) {
    pTVar3 = Context::getTestContext(context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    bVar1 = ::vk::validateAndLog
                      (pTVar4,(AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_930,"Ok",&local_931);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_930);
      std::__cxx11::string::~string((string *)&local_930);
      std::allocator<char>::~allocator(&local_931);
      local_8c0 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_908,"Invalid allocation callback",&local_909);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_908);
      std::__cxx11::string::~string((string *)&local_908);
      std::allocator<char>::~allocator(&local_909);
      local_8c0 = 1;
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}